

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

void drmp3_L3_imdct36(float *grbuf,float *overlap,float *window,int nbands)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  float *in_RDI;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float sum;
  float ovl;
  drmp3_f4 vsum;
  drmp3_f4 vw1;
  drmp3_f4 vw0;
  drmp3_f4 vr1;
  drmp3_f4 vr0;
  drmp3_f4 vs;
  drmp3_f4 vc;
  drmp3_f4 vovl;
  float si [9];
  float co [9];
  int j;
  int i;
  float local_2a8;
  uint local_2a4;
  undefined8 uStack_2a0;
  float fStack_298;
  uint local_294;
  uint local_28c;
  float local_278 [2];
  undefined8 auStack_270 [4];
  int local_24c;
  int local_248;
  int local_244;
  long local_240;
  long local_238;
  float *local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 *local_120;
  undefined8 *local_118;
  float *local_110;
  float *local_108;
  float *local_100;
  float *local_f8;
  undefined8 *local_f0;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float *local_d0;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float *local_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 *local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  
  local_244 = in_ECX;
  local_240 = in_RDX;
  local_238 = in_RSI;
  local_230 = in_RDI;
  for (local_24c = 0; local_24c < local_244; local_24c = local_24c + 1) {
    local_278[0] = -*local_230;
    local_2a8 = local_230[0x11];
    for (local_248 = 0; local_248 < 4; local_248 = local_248 + 1) {
      (&local_2a8)[local_248 * -2 + 8] = local_230[local_248 * 4 + 1] - local_230[local_248 * 4 + 2]
      ;
      local_278[local_248 * 2 + 1] = local_230[local_248 * 4 + 1] + local_230[local_248 * 4 + 2];
      (&local_2a8)[local_248 * -2 + 7] = local_230[local_248 * 4 + 4] - local_230[local_248 * 4 + 3]
      ;
      local_278[local_248 * 2 + 2] = -(local_230[local_248 * 4 + 3] + local_230[local_248 * 4 + 4]);
    }
    drmp3_L3_dct3_9(local_278);
    drmp3_L3_dct3_9(&local_2a8);
    local_2a4 = local_2a4 ^ 0x80000000;
    uStack_2a0._4_4_ = uStack_2a0._4_4_ ^ 0x80000000;
    local_294 = local_294 ^ 0x80000000;
    local_28c = local_28c ^ 0x80000000;
    local_248 = 0;
    iVar15 = drmp3_have_simd();
    if (iVar15 != 0) {
      for (; local_248 < 8; local_248 = local_248 + 4) {
        local_f0 = (undefined8 *)(local_238 + (long)local_248 * 4);
        local_1f8 = *local_f0;
        uStack_1f0 = local_f0[1];
        local_f8 = local_278 + local_248;
        local_178 = *(undefined8 *)(local_278 + local_248);
        uStack_170 = *(undefined8 *)((long)auStack_270 + (long)local_248 * 4);
        local_100 = &local_2a8 + local_248;
        local_198 = *(undefined8 *)(&local_2a8 + local_248);
        uStack_190 = *(undefined8 *)((long)&uStack_2a0 + (long)local_248 * 4);
        local_108 = drmp3_L3_imdct36::g_twid9 + local_248;
        local_188 = *(undefined8 *)(drmp3_L3_imdct36::g_twid9 + local_248);
        uStack_180 = *(undefined8 *)(drmp3_L3_imdct36::g_twid9 + (long)local_248 + 2);
        local_110 = drmp3_L3_imdct36::g_twid9 + (long)local_248 + 9;
        local_1a8 = *(undefined8 *)(drmp3_L3_imdct36::g_twid9 + (long)local_248 + 9);
        uStack_1a0 = *(undefined8 *)(drmp3_L3_imdct36::g_twid9 + (long)local_248 + 0xb);
        local_118 = (undefined8 *)(local_240 + (long)local_248 * 4);
        local_228 = *local_118;
        uStack_220 = local_118[1];
        local_120 = (undefined8 *)(local_240 + 0x24 + (long)local_248 * 4);
        local_208 = *local_120;
        uStack_200 = local_120[1];
        local_138 = local_178;
        uVar13 = local_138;
        uStack_130 = uStack_170;
        uVar14 = uStack_130;
        local_148 = local_1a8;
        uVar11 = local_148;
        uStack_140 = uStack_1a0;
        uVar12 = uStack_140;
        local_138._0_4_ = (float)local_178;
        local_138._4_4_ = (float)((ulong)local_178 >> 0x20);
        uStack_130._0_4_ = (float)uStack_170;
        uStack_130._4_4_ = (float)((ulong)uStack_170 >> 0x20);
        local_148._0_4_ = (float)local_1a8;
        local_148._4_4_ = (float)((ulong)local_1a8 >> 0x20);
        uStack_140._0_4_ = (float)uStack_1a0;
        uStack_140._4_4_ = (float)((ulong)uStack_1a0 >> 0x20);
        local_158 = local_198;
        uVar9 = local_158;
        uStack_150 = uStack_190;
        uVar10 = uStack_150;
        local_168 = local_188;
        uVar7 = local_168;
        uStack_160 = uStack_180;
        uVar8 = uStack_160;
        local_158._0_4_ = (float)local_198;
        local_158._4_4_ = (float)((ulong)local_198 >> 0x20);
        uStack_150._0_4_ = (float)uStack_190;
        uStack_150._4_4_ = (float)((ulong)uStack_190 >> 0x20);
        local_168._0_4_ = (float)local_188;
        local_168._4_4_ = (float)((ulong)local_188 >> 0x20);
        uStack_160._0_4_ = (float)uStack_180;
        uStack_160._4_4_ = (float)((ulong)uStack_180 >> 0x20);
        local_58 = (float)local_138 * (float)local_148;
        fStack_54 = local_138._4_4_ * local_148._4_4_;
        fStack_50 = (float)uStack_130 * (float)uStack_140;
        fStack_4c = uStack_130._4_4_ * uStack_140._4_4_;
        local_68 = (float)local_158 * (float)local_168;
        fStack_64 = local_158._4_4_ * local_168._4_4_;
        fStack_60 = (float)uStack_150 * (float)uStack_160;
        fStack_5c = uStack_150._4_4_ * uStack_160._4_4_;
        fVar16 = (float)local_138 * (float)local_148 + (float)local_158 * (float)local_168;
        fVar17 = local_138._4_4_ * local_148._4_4_ + local_158._4_4_ * local_168._4_4_;
        fVar18 = (float)uStack_130 * (float)uStack_140 + (float)uStack_150 * (float)uStack_160;
        fVar19 = uStack_130._4_4_ * uStack_140._4_4_ + uStack_150._4_4_ * uStack_160._4_4_;
        local_90 = (undefined8 *)(local_238 + (long)local_248 * 4);
        local_18 = (float)local_138 * (float)local_168;
        fStack_14 = local_138._4_4_ * local_168._4_4_;
        fStack_10 = (float)uStack_130 * (float)uStack_160;
        fStack_c = uStack_130._4_4_ * uStack_160._4_4_;
        local_28 = (float)local_158 * (float)local_148;
        fStack_24 = local_158._4_4_ * local_148._4_4_;
        fStack_20 = (float)uStack_150 * (float)uStack_140;
        fStack_1c = uStack_150._4_4_ * uStack_140._4_4_;
        local_a8 = (float)local_138 * (float)local_168 - (float)local_158 * (float)local_148;
        fStack_a4 = local_138._4_4_ * local_168._4_4_ - local_158._4_4_ * local_148._4_4_;
        fStack_a0 = (float)uStack_130 * (float)uStack_160 - (float)uStack_150 * (float)uStack_140;
        fStack_9c = uStack_130._4_4_ * uStack_160._4_4_ - uStack_150._4_4_ * uStack_140._4_4_;
        *local_90 = CONCAT44(fStack_a4,local_a8);
        local_90[1] = CONCAT44(fStack_9c,fStack_a0);
        local_b0 = local_230 + local_248;
        local_1b8 = local_1f8;
        uVar5 = local_1b8;
        uStack_1b0 = uStack_1f0;
        uVar6 = uStack_1b0;
        local_1c8 = local_228;
        uVar3 = local_1c8;
        uStack_1c0 = uStack_220;
        uVar4 = uStack_1c0;
        local_1b8._0_4_ = (float)local_1f8;
        local_1b8._4_4_ = (float)((ulong)local_1f8 >> 0x20);
        uStack_1b0._0_4_ = (float)uStack_1f0;
        uStack_1b0._4_4_ = (float)((ulong)uStack_1f0 >> 0x20);
        local_1c8._0_4_ = (float)local_228;
        local_1c8._4_4_ = (float)((ulong)local_228 >> 0x20);
        uStack_1c0._0_4_ = (float)uStack_220;
        uStack_1c0._4_4_ = (float)((ulong)uStack_220 >> 0x20);
        local_1d8 = CONCAT44(fVar17,fVar16);
        uStack_1d0 = CONCAT44(fVar19,fVar18);
        local_1e8 = local_208;
        uVar1 = local_1e8;
        uStack_1e0 = uStack_200;
        uVar2 = uStack_1e0;
        local_1e8._0_4_ = (float)local_208;
        local_1e8._4_4_ = (float)((ulong)local_208 >> 0x20);
        uStack_1e0._0_4_ = (float)uStack_200;
        uStack_1e0._4_4_ = (float)((ulong)uStack_200 >> 0x20);
        local_38 = (float)local_1b8 * (float)local_1c8;
        fStack_34 = local_1b8._4_4_ * local_1c8._4_4_;
        fStack_30 = (float)uStack_1b0 * (float)uStack_1c0;
        fStack_2c = uStack_1b0._4_4_ * uStack_1c0._4_4_;
        local_48 = fVar16 * (float)local_1e8;
        fStack_44 = fVar17 * local_1e8._4_4_;
        fStack_40 = fVar18 * (float)uStack_1e0;
        fStack_3c = fVar19 * uStack_1e0._4_4_;
        local_c8 = (float)local_1b8 * (float)local_1c8 - fVar16 * (float)local_1e8;
        fStack_c4 = local_1b8._4_4_ * local_1c8._4_4_ - fVar17 * local_1e8._4_4_;
        fStack_c0 = (float)uStack_1b0 * (float)uStack_1c0 - fVar18 * (float)uStack_1e0;
        fStack_bc = uStack_1b0._4_4_ * uStack_1c0._4_4_ - fVar19 * uStack_1e0._4_4_;
        *(ulong *)local_b0 = CONCAT44(fStack_c4,local_c8);
        *(ulong *)(local_b0 + 2) = CONCAT44(fStack_bc,fStack_c0);
        local_218 = CONCAT44(fVar17,fVar16);
        uStack_210 = CONCAT44(fVar19,fVar18);
        local_78 = (float)local_1b8 * (float)local_1e8;
        fStack_74 = local_1b8._4_4_ * local_1e8._4_4_;
        fStack_70 = (float)uStack_1b0 * (float)uStack_1e0;
        fStack_6c = uStack_1b0._4_4_ * uStack_1e0._4_4_;
        local_88 = fVar16 * (float)local_1c8;
        fStack_84 = fVar17 * local_1c8._4_4_;
        fStack_80 = fVar18 * (float)uStack_1c0;
        fStack_7c = fVar19 * uStack_1c0._4_4_;
        fStack_dc = (float)local_1b8 * (float)local_1e8 + fVar16 * (float)local_1c8;
        fStack_e0 = local_1b8._4_4_ * local_1e8._4_4_ + fVar17 * local_1c8._4_4_;
        fStack_e4 = (float)uStack_1b0 * (float)uStack_1e0 + fVar18 * (float)uStack_1c0;
        local_e8 = uStack_1b0._4_4_ * uStack_1e0._4_4_ + fVar19 * uStack_1c0._4_4_;
        local_d0 = local_230 + (0xe - (long)local_248);
        *(ulong *)(local_230 + (0xe - (long)local_248)) = CONCAT44(fStack_e4,local_e8);
        *(ulong *)(local_230 + (0x10 - (long)local_248)) = CONCAT44(fStack_dc,fStack_e0);
        local_1e8 = uVar1;
        uStack_1e0 = uVar2;
        local_1c8 = uVar3;
        uStack_1c0 = uVar4;
        local_1b8 = uVar5;
        uStack_1b0 = uVar6;
        local_168 = uVar7;
        uStack_160 = uVar8;
        local_158 = uVar9;
        uStack_150 = uVar10;
        local_148 = uVar11;
        uStack_140 = uVar12;
        local_138 = uVar13;
        uStack_130 = uVar14;
      }
    }
    for (; local_248 < 9; local_248 = local_248 + 1) {
      fVar16 = *(float *)(local_238 + (long)local_248 * 4);
      fVar17 = local_278[local_248] * drmp3_L3_imdct36::g_twid9[local_248 + 9] +
               (&local_2a8)[local_248] * drmp3_L3_imdct36::g_twid9[local_248];
      *(float *)(local_238 + (long)local_248 * 4) =
           local_278[local_248] * drmp3_L3_imdct36::g_twid9[local_248] +
           -((&local_2a8)[local_248] * drmp3_L3_imdct36::g_twid9[local_248 + 9]);
      local_230[local_248] =
           fVar16 * *(float *)(local_240 + (long)local_248 * 4) +
           -(fVar17 * *(float *)(local_240 + (long)(local_248 + 9) * 4));
      local_230[0x11 - local_248] =
           fVar16 * *(float *)(local_240 + (long)(local_248 + 9) * 4) +
           fVar17 * *(float *)(local_240 + (long)local_248 * 4);
    }
    local_230 = local_230 + 0x12;
    local_238 = local_238 + 0x24;
  }
  return;
}

Assistant:

static void drmp3_L3_imdct36(float *grbuf, float *overlap, const float *window, int nbands)
{
    int i, j;
    static const float g_twid9[18] = {
            0.73727734f,0.79335334f,0.84339145f,0.88701083f,0.92387953f,0.95371695f,0.97629601f,0.99144486f,0.99904822f,0.67559021f,0.60876143f,0.53729961f,0.46174861f,0.38268343f,0.30070580f,0.21643961f,0.13052619f,0.04361938f
    };

    for (j = 0; j < nbands; j++, grbuf += 18, overlap += 9)
    {
        float co[9], si[9];
        co[0] = -grbuf[0];
        si[0] = grbuf[17];
        for (i = 0; i < 4; i++)
        {
            si[8 - 2*i] =   grbuf[4*i + 1] - grbuf[4*i + 2];
            co[1 + 2*i] =   grbuf[4*i + 1] + grbuf[4*i + 2];
            si[7 - 2*i] =   grbuf[4*i + 4] - grbuf[4*i + 3];
            co[2 + 2*i] = -(grbuf[4*i + 3] + grbuf[4*i + 4]);
        }
        drmp3_L3_dct3_9(co);
        drmp3_L3_dct3_9(si);

        si[1] = -si[1];
        si[3] = -si[3];
        si[5] = -si[5];
        si[7] = -si[7];

        i = 0;

#if DRMP3_HAVE_SIMD
        if (drmp3_have_simd()) for (; i < 8; i += 4)
            {
                drmp3_f4 vovl = DRMP3_VLD(overlap + i);
                drmp3_f4 vc = DRMP3_VLD(co + i);
                drmp3_f4 vs = DRMP3_VLD(si + i);
                drmp3_f4 vr0 = DRMP3_VLD(g_twid9 + i);
                drmp3_f4 vr1 = DRMP3_VLD(g_twid9 + 9 + i);
                drmp3_f4 vw0 = DRMP3_VLD(window + i);
                drmp3_f4 vw1 = DRMP3_VLD(window + 9 + i);
                drmp3_f4 vsum = DRMP3_VADD(DRMP3_VMUL(vc, vr1), DRMP3_VMUL(vs, vr0));
                DRMP3_VSTORE(overlap + i, DRMP3_VSUB(DRMP3_VMUL(vc, vr0), DRMP3_VMUL(vs, vr1)));
                DRMP3_VSTORE(grbuf + i, DRMP3_VSUB(DRMP3_VMUL(vovl, vw0), DRMP3_VMUL(vsum, vw1)));
                vsum = DRMP3_VADD(DRMP3_VMUL(vovl, vw1), DRMP3_VMUL(vsum, vw0));
                DRMP3_VSTORE(grbuf + 14 - i, DRMP3_VREV(vsum));
            }
#endif
        for (; i < 9; i++)
        {
            float ovl  = overlap[i];
            float sum  = co[i]*g_twid9[9 + i] + si[i]*g_twid9[0 + i];
            overlap[i] = co[i]*g_twid9[0 + i] - si[i]*g_twid9[9 + i];
            grbuf[i]      = ovl*window[0 + i] - sum*window[9 + i];
            grbuf[17 - i] = ovl*window[9 + i] + sum*window[0 + i];
        }
    }
}